

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O0

PointAttribute * __thiscall
draco::SequentialAttributeDecoder::GetPortableAttribute(SequentialAttributeDecoder *this)

{
  bool bVar1;
  size_t sVar2;
  pointer pPVar3;
  long in_RDI;
  PointIndex i;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  uint local_10;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_c [3];
  
  bVar1 = PointAttribute::is_mapping_identity(*(PointAttribute **)(in_RDI + 0x10));
  if ((!bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                          *)0x2a4712), bVar1)) {
    pPVar3 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
             operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         *)0x2a4729);
    bVar1 = PointAttribute::is_mapping_identity(pPVar3);
    if (bVar1) {
      in_stack_ffffffffffffffd0 =
           std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
           operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)0x2a4748);
      PointAttribute::indices_map_size(in_stack_ffffffffffffffc8);
      PointAttribute::SetExplicitMapping
                (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(local_c,0);
      while( true ) {
        sVar2 = PointAttribute::indices_map_size(in_stack_ffffffffffffffc8);
        local_10 = (uint)sVar2;
        bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(local_c,&local_10);
        if (!bVar1) break;
        in_stack_ffffffffffffffc8 =
             std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
             operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         *)0x2a47ac);
        PointAttribute::mapped_index
                  (in_stack_ffffffffffffffc8,(PointIndex)(uint)in_stack_ffffffffffffffd0);
        PointAttribute::SetPointMapEntry
                  (in_stack_ffffffffffffffc8,
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffffd0);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(local_c);
      }
    }
  }
  pPVar3 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::get
                     ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)in_stack_ffffffffffffffd0);
  return pPVar3;
}

Assistant:

const PointAttribute *SequentialAttributeDecoder::GetPortableAttribute() {
  // If needed, copy point to attribute value index mapping from the final
  // attribute to the portable attribute.
  if (!attribute_->is_mapping_identity() && portable_attribute_ &&
      portable_attribute_->is_mapping_identity()) {
    portable_attribute_->SetExplicitMapping(attribute_->indices_map_size());
    for (PointIndex i(0);
         i < static_cast<uint32_t>(attribute_->indices_map_size()); ++i) {
      portable_attribute_->SetPointMapEntry(i, attribute_->mapped_index(i));
    }
  }
  return portable_attribute_.get();
}